

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi_loadf(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  FILE *f;
  float *result;
  int in_stack_00000094;
  int *in_stack_00000098;
  int *in_stack_000000a0;
  int *in_stack_000000a8;
  FILE *in_stack_000000b0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  float *local_8;
  
  __stream = (FILE *)stbi__fopen(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__stream == (FILE *)0x0) {
    stbi__err("Unable to open file");
    local_8 = (float *)0x0;
  }
  else {
    local_8 = stbi_loadf_from_file
                        (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000094);
    fclose(__stream);
  }
  return local_8;
}

Assistant:

STBIDEF float *stbi_loadf(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   float *result;
   FILE *f = stbi__fopen(filename, "rb");
   if (!f) return stbi__errpf("can't fopen", "Unable to open file");
   result = stbi_loadf_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}